

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O0

int mbedtls_ctr_drbg_self_test(int verbose)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [11];
  undefined1 auVar6 [11];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  int iVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  byte bVar29;
  uchar uStack_178;
  char cStack_177;
  char cStack_176;
  char cStack_175;
  char cStack_174;
  char cStack_173;
  char cStack_172;
  char cStack_171;
  uchar buf [16];
  mbedtls_ctr_drbg_context ctx;
  int verbose_local;
  
  mbedtls_ctr_drbg_init((mbedtls_ctr_drbg_context *)(buf + 8));
  if (verbose != 0) {
    printf("  CTR_DRBG (PR = TRUE) : ");
  }
  test_offset = 0;
  iVar13 = mbedtls_ctr_drbg_seed_entropy_len
                     ((mbedtls_ctr_drbg_context *)(buf + 8),ctr_drbg_self_test_entropy,
                      entropy_source_pr,nonce_pers_pr,0x10,0x20);
  if (iVar13 == 0) {
    mbedtls_ctr_drbg_set_prediction_resistance((mbedtls_ctr_drbg_context *)(buf + 8),1);
    iVar13 = mbedtls_ctr_drbg_random(buf + 8,&uStack_178,0x10);
    if (iVar13 == 0) {
      iVar13 = mbedtls_ctr_drbg_random(buf + 8,&uStack_178,0x10);
      if (iVar13 == 0) {
        cVar14 = -(uStack_178 == DAT_0012af50);
        cVar15 = -(cStack_177 == DAT_0012af50._1_1_);
        cVar16 = -(cStack_176 == DAT_0012af50._2_1_);
        cVar17 = -(cStack_175 == DAT_0012af50._3_1_);
        cVar18 = -(cStack_174 == DAT_0012af50._4_1_);
        cVar19 = -(cStack_173 == DAT_0012af50._5_1_);
        cVar20 = -(cStack_172 == DAT_0012af50._6_1_);
        cVar21 = -(cStack_171 == DAT_0012af50._7_1_);
        cVar22 = -(buf[0] == DAT_0012af50._8_1_);
        cVar23 = -(buf[1] == DAT_0012af50._9_1_);
        cVar24 = -(buf[2] == DAT_0012af50._10_1_);
        cVar25 = -(buf[3] == DAT_0012af50._11_1_);
        cVar26 = -(buf[4] == DAT_0012af50._12_1_);
        cVar27 = -(buf[5] == DAT_0012af50._13_1_);
        cVar28 = -(buf[6] == DAT_0012af50._14_1_);
        bVar29 = -(buf[7] == DAT_0012af50._15_1_);
        auVar1[1] = cVar15;
        auVar1[0] = cVar14;
        auVar1[2] = cVar16;
        auVar1[3] = cVar17;
        auVar1[4] = cVar18;
        auVar1[5] = cVar19;
        auVar1[6] = cVar20;
        auVar1[7] = cVar21;
        auVar1[8] = cVar22;
        auVar1[9] = cVar23;
        auVar1[10] = cVar24;
        auVar1[0xb] = cVar25;
        auVar1[0xc] = cVar26;
        auVar1[0xd] = cVar27;
        auVar1[0xe] = cVar28;
        auVar1[0xf] = bVar29;
        auVar2[1] = cVar15;
        auVar2[0] = cVar14;
        auVar2[2] = cVar16;
        auVar2[3] = cVar17;
        auVar2[4] = cVar18;
        auVar2[5] = cVar19;
        auVar2[6] = cVar20;
        auVar2[7] = cVar21;
        auVar2[8] = cVar22;
        auVar2[9] = cVar23;
        auVar2[10] = cVar24;
        auVar2[0xb] = cVar25;
        auVar2[0xc] = cVar26;
        auVar2[0xd] = cVar27;
        auVar2[0xe] = cVar28;
        auVar2[0xf] = bVar29;
        auVar11[1] = cVar17;
        auVar11[0] = cVar16;
        auVar11[2] = cVar18;
        auVar11[3] = cVar19;
        auVar11[4] = cVar20;
        auVar11[5] = cVar21;
        auVar11[6] = cVar22;
        auVar11[7] = cVar23;
        auVar11[8] = cVar24;
        auVar11[9] = cVar25;
        auVar11[10] = cVar26;
        auVar11[0xb] = cVar27;
        auVar11[0xc] = cVar28;
        auVar11[0xd] = bVar29;
        auVar9[1] = cVar18;
        auVar9[0] = cVar17;
        auVar9[2] = cVar19;
        auVar9[3] = cVar20;
        auVar9[4] = cVar21;
        auVar9[5] = cVar22;
        auVar9[6] = cVar23;
        auVar9[7] = cVar24;
        auVar9[8] = cVar25;
        auVar9[9] = cVar26;
        auVar9[10] = cVar27;
        auVar9[0xb] = cVar28;
        auVar9[0xc] = bVar29;
        auVar7[1] = cVar19;
        auVar7[0] = cVar18;
        auVar7[2] = cVar20;
        auVar7[3] = cVar21;
        auVar7[4] = cVar22;
        auVar7[5] = cVar23;
        auVar7[6] = cVar24;
        auVar7[7] = cVar25;
        auVar7[8] = cVar26;
        auVar7[9] = cVar27;
        auVar7[10] = cVar28;
        auVar7[0xb] = bVar29;
        auVar5[1] = cVar20;
        auVar5[0] = cVar19;
        auVar5[2] = cVar21;
        auVar5[3] = cVar22;
        auVar5[4] = cVar23;
        auVar5[5] = cVar24;
        auVar5[6] = cVar25;
        auVar5[7] = cVar26;
        auVar5[8] = cVar27;
        auVar5[9] = cVar28;
        auVar5[10] = bVar29;
        if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB141(auVar11 >> 7,0) & 1) << 2 |
                     (ushort)(SUB131(auVar9 >> 7,0) & 1) << 3 |
                     (ushort)(SUB121(auVar7 >> 7,0) & 1) << 4 |
                     (ushort)(SUB111(auVar5 >> 7,0) & 1) << 5 |
                     (ushort)((byte)(CONCAT19(bVar29,CONCAT18(cVar28,CONCAT17(cVar27,CONCAT16(cVar26
                                                  ,CONCAT15(cVar25,CONCAT14(cVar24,CONCAT13(cVar23,
                                                  CONCAT12(cVar22,CONCAT11(cVar21,cVar20))))))))) >>
                                    7) & 1) << 6 |
                     (ushort)((byte)(CONCAT18(bVar29,CONCAT17(cVar28,CONCAT16(cVar27,CONCAT15(cVar26
                                                  ,CONCAT14(cVar25,CONCAT13(cVar24,CONCAT12(cVar23,
                                                  CONCAT11(cVar22,cVar21)))))))) >> 7) & 1) << 7 |
                    (ushort)(bVar29 >> 7) << 0xf) == 0xffff) {
          mbedtls_ctr_drbg_free((mbedtls_ctr_drbg_context *)(buf + 8));
          if (verbose != 0) {
            printf("passed\n");
            printf("  CTR_DRBG (PR = FALSE): ");
          }
          mbedtls_ctr_drbg_init((mbedtls_ctr_drbg_context *)(buf + 8));
          test_offset = 0;
          iVar13 = mbedtls_ctr_drbg_seed_entropy_len
                             ((mbedtls_ctr_drbg_context *)(buf + 8),ctr_drbg_self_test_entropy,
                              entropy_source_nopr,nonce_pers_nopr,0x10,0x20);
          if (iVar13 == 0) {
            iVar13 = mbedtls_ctr_drbg_random(buf + 8,&uStack_178,0x10);
            if (iVar13 == 0) {
              iVar13 = mbedtls_ctr_drbg_reseed((mbedtls_ctr_drbg_context *)(buf + 8),(uchar *)0x0,0)
              ;
              if (iVar13 == 0) {
                iVar13 = mbedtls_ctr_drbg_random(buf + 8,&uStack_178,0x10);
                if (iVar13 == 0) {
                  cVar14 = -(uStack_178 == DAT_0012af60);
                  cVar15 = -(cStack_177 == DAT_0012af60._1_1_);
                  cVar16 = -(cStack_176 == DAT_0012af60._2_1_);
                  cVar17 = -(cStack_175 == DAT_0012af60._3_1_);
                  cVar18 = -(cStack_174 == DAT_0012af60._4_1_);
                  cVar19 = -(cStack_173 == DAT_0012af60._5_1_);
                  cVar20 = -(cStack_172 == DAT_0012af60._6_1_);
                  cVar21 = -(cStack_171 == DAT_0012af60._7_1_);
                  cVar22 = -(buf[0] == DAT_0012af60._8_1_);
                  cVar23 = -(buf[1] == DAT_0012af60._9_1_);
                  cVar24 = -(buf[2] == DAT_0012af60._10_1_);
                  cVar25 = -(buf[3] == DAT_0012af60._11_1_);
                  cVar26 = -(buf[4] == DAT_0012af60._12_1_);
                  cVar27 = -(buf[5] == DAT_0012af60._13_1_);
                  cVar28 = -(buf[6] == DAT_0012af60._14_1_);
                  bVar29 = -(buf[7] == DAT_0012af60._15_1_);
                  auVar3[1] = cVar15;
                  auVar3[0] = cVar14;
                  auVar3[2] = cVar16;
                  auVar3[3] = cVar17;
                  auVar3[4] = cVar18;
                  auVar3[5] = cVar19;
                  auVar3[6] = cVar20;
                  auVar3[7] = cVar21;
                  auVar3[8] = cVar22;
                  auVar3[9] = cVar23;
                  auVar3[10] = cVar24;
                  auVar3[0xb] = cVar25;
                  auVar3[0xc] = cVar26;
                  auVar3[0xd] = cVar27;
                  auVar3[0xe] = cVar28;
                  auVar3[0xf] = bVar29;
                  auVar4[1] = cVar15;
                  auVar4[0] = cVar14;
                  auVar4[2] = cVar16;
                  auVar4[3] = cVar17;
                  auVar4[4] = cVar18;
                  auVar4[5] = cVar19;
                  auVar4[6] = cVar20;
                  auVar4[7] = cVar21;
                  auVar4[8] = cVar22;
                  auVar4[9] = cVar23;
                  auVar4[10] = cVar24;
                  auVar4[0xb] = cVar25;
                  auVar4[0xc] = cVar26;
                  auVar4[0xd] = cVar27;
                  auVar4[0xe] = cVar28;
                  auVar4[0xf] = bVar29;
                  auVar12[1] = cVar17;
                  auVar12[0] = cVar16;
                  auVar12[2] = cVar18;
                  auVar12[3] = cVar19;
                  auVar12[4] = cVar20;
                  auVar12[5] = cVar21;
                  auVar12[6] = cVar22;
                  auVar12[7] = cVar23;
                  auVar12[8] = cVar24;
                  auVar12[9] = cVar25;
                  auVar12[10] = cVar26;
                  auVar12[0xb] = cVar27;
                  auVar12[0xc] = cVar28;
                  auVar12[0xd] = bVar29;
                  auVar10[1] = cVar18;
                  auVar10[0] = cVar17;
                  auVar10[2] = cVar19;
                  auVar10[3] = cVar20;
                  auVar10[4] = cVar21;
                  auVar10[5] = cVar22;
                  auVar10[6] = cVar23;
                  auVar10[7] = cVar24;
                  auVar10[8] = cVar25;
                  auVar10[9] = cVar26;
                  auVar10[10] = cVar27;
                  auVar10[0xb] = cVar28;
                  auVar10[0xc] = bVar29;
                  auVar8[1] = cVar19;
                  auVar8[0] = cVar18;
                  auVar8[2] = cVar20;
                  auVar8[3] = cVar21;
                  auVar8[4] = cVar22;
                  auVar8[5] = cVar23;
                  auVar8[6] = cVar24;
                  auVar8[7] = cVar25;
                  auVar8[8] = cVar26;
                  auVar8[9] = cVar27;
                  auVar8[10] = cVar28;
                  auVar8[0xb] = bVar29;
                  auVar6[1] = cVar20;
                  auVar6[0] = cVar19;
                  auVar6[2] = cVar21;
                  auVar6[3] = cVar22;
                  auVar6[4] = cVar23;
                  auVar6[5] = cVar24;
                  auVar6[6] = cVar25;
                  auVar6[7] = cVar26;
                  auVar6[8] = cVar27;
                  auVar6[9] = cVar28;
                  auVar6[10] = bVar29;
                  if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB141(auVar12 >> 7,0) & 1) << 2 |
                               (ushort)(SUB131(auVar10 >> 7,0) & 1) << 3 |
                               (ushort)(SUB121(auVar8 >> 7,0) & 1) << 4 |
                               (ushort)(SUB111(auVar6 >> 7,0) & 1) << 5 |
                               (ushort)((byte)(CONCAT19(bVar29,CONCAT18(cVar28,CONCAT17(cVar27,
                                                  CONCAT16(cVar26,CONCAT15(cVar25,CONCAT14(cVar24,
                                                  CONCAT13(cVar23,CONCAT12(cVar22,CONCAT11(cVar21,
                                                  cVar20))))))))) >> 7) & 1) << 6 |
                               (ushort)((byte)(CONCAT18(bVar29,CONCAT17(cVar28,CONCAT16(cVar27,
                                                  CONCAT15(cVar26,CONCAT14(cVar25,CONCAT13(cVar24,
                                                  CONCAT12(cVar23,CONCAT11(cVar22,cVar21)))))))) >>
                                              7) & 1) << 7 | (ushort)(bVar29 >> 7) << 0xf) == 0xffff
                     ) {
                    mbedtls_ctr_drbg_free((mbedtls_ctr_drbg_context *)(buf + 8));
                    if (verbose != 0) {
                      printf("passed\n");
                      printf(anon_var_dwarf_a2ec + 8);
                    }
                    ctx.p_entropy._4_4_ = 0;
                  }
                  else {
                    if (verbose != 0) {
                      printf("failed\n");
                    }
                    ctx.p_entropy._4_4_ = 1;
                  }
                }
                else {
                  if (verbose != 0) {
                    printf("failed\n");
                  }
                  ctx.p_entropy._4_4_ = 1;
                }
              }
              else {
                if (verbose != 0) {
                  printf("failed\n");
                }
                ctx.p_entropy._4_4_ = 1;
              }
            }
            else {
              if (verbose != 0) {
                printf("failed\n");
              }
              ctx.p_entropy._4_4_ = 1;
            }
          }
          else {
            if (verbose != 0) {
              printf("failed\n");
            }
            ctx.p_entropy._4_4_ = 1;
          }
        }
        else {
          if (verbose != 0) {
            printf("failed\n");
          }
          ctx.p_entropy._4_4_ = 1;
        }
      }
      else {
        if (verbose != 0) {
          printf("failed\n");
        }
        ctx.p_entropy._4_4_ = 1;
      }
    }
    else {
      if (verbose != 0) {
        printf("failed\n");
      }
      ctx.p_entropy._4_4_ = 1;
    }
  }
  else {
    if (verbose != 0) {
      printf("failed\n");
    }
    ctx.p_entropy._4_4_ = 1;
  }
  return ctx.p_entropy._4_4_;
}

Assistant:

int mbedtls_ctr_drbg_self_test( int verbose )
{
    mbedtls_ctr_drbg_context ctx;
    unsigned char buf[16];

    mbedtls_ctr_drbg_init( &ctx );

    /*
     * Based on a NIST CTR_DRBG test vector (PR = True)
     */
    if( verbose != 0 )
        mbedtls_printf( "  CTR_DRBG (PR = TRUE) : " );

    test_offset = 0;
    CHK( mbedtls_ctr_drbg_seed_entropy_len( &ctx, ctr_drbg_self_test_entropy,
                                (void *) entropy_source_pr, nonce_pers_pr, 16, 32 ) );
    mbedtls_ctr_drbg_set_prediction_resistance( &ctx, MBEDTLS_CTR_DRBG_PR_ON );
    CHK( mbedtls_ctr_drbg_random( &ctx, buf, MBEDTLS_CTR_DRBG_BLOCKSIZE ) );
    CHK( mbedtls_ctr_drbg_random( &ctx, buf, MBEDTLS_CTR_DRBG_BLOCKSIZE ) );
    CHK( memcmp( buf, result_pr, MBEDTLS_CTR_DRBG_BLOCKSIZE ) );

    mbedtls_ctr_drbg_free( &ctx );

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    /*
     * Based on a NIST CTR_DRBG test vector (PR = FALSE)
     */
    if( verbose != 0 )
        mbedtls_printf( "  CTR_DRBG (PR = FALSE): " );

    mbedtls_ctr_drbg_init( &ctx );

    test_offset = 0;
    CHK( mbedtls_ctr_drbg_seed_entropy_len( &ctx, ctr_drbg_self_test_entropy,
                            (void *) entropy_source_nopr, nonce_pers_nopr, 16, 32 ) );
    CHK( mbedtls_ctr_drbg_random( &ctx, buf, 16 ) );
    CHK( mbedtls_ctr_drbg_reseed( &ctx, NULL, 0 ) );
    CHK( mbedtls_ctr_drbg_random( &ctx, buf, 16 ) );
    CHK( memcmp( buf, result_nopr, 16 ) );

    mbedtls_ctr_drbg_free( &ctx );

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    if( verbose != 0 )
            mbedtls_printf( "\n" );

    return( 0 );
}